

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O0

bool __thiscall jbcoin::STAccount::isEquivalent(STAccount *this,STBase *t)

{
  bool local_39;
  long local_38;
  STAccount *tPtr;
  STBase *t_local;
  STAccount *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if ((local_38 != 0) &&
     (local_39 = false, (this->default_ & 1U) == (*(byte *)(local_38 + 0x24) & 1))) {
    local_39 = jbcoin::operator==(&this->value_,(base_uint<160UL,_void> *)(local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        auto const* const tPtr = dynamic_cast<STAccount const*>(&t);
        return tPtr && (default_ == tPtr->default_) && (value_ == tPtr->value_);
    }